

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc-pico.c
# Opt level: O0

uint32_t calc_bytes_per_mtu_increase(uint32_t cwnd,uint32_t ssthresh,uint32_t rtt,uint32_t mtu)

{
  double increase_per_byte;
  uint32_t mtu_local;
  uint32_t rtt_local;
  uint32_t ssthresh_local;
  uint32_t cwnd_local;
  
  if (cwnd < ssthresh) {
    increase_per_byte = (double)mtu / (double)cwnd + 1.0;
  }
  else {
    increase_per_byte = (double)rtt * 0.0004285714285714286 + (double)mtu / (double)cwnd;
  }
  return (uint32_t)(long)((double)mtu / increase_per_byte);
}

Assistant:

static uint32_t calc_bytes_per_mtu_increase(uint32_t cwnd, uint32_t ssthresh, uint32_t rtt, uint32_t mtu)
{
    /* Increase per byte acked is the sum of 1mtu/cwnd (additive part) and ... */
    double increase_per_byte = (double)mtu / cwnd;
    /* ... multiplicative part being 1 during slow start, and the RTT-compensated rate for recovery within ~1/QUICLY_PICO_MULT_HZ
     * seconds congestion avoidance. */
    if (cwnd < ssthresh) {
        increase_per_byte += 1;
    } else {
        increase_per_byte += (1 / QUICLY_RENO_BETA - 1) * QUICLY_PICO_MULT_HZ / 1000 * rtt;
    }

    return (uint32_t)(mtu / increase_per_byte);
}